

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

int32 rw::ps2::getRasterFormat(Raster *raster)

{
  int iVar1;
  FILE *__stream;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  undefined8 uStack_30;
  Error _e;
  
  iVar1 = cameraZDepth;
  if (5 < (uint)raster->type) {
switchD_001231e9_caseD_3:
    uStack_30 = 0xf3;
    goto LAB_00123766;
  }
  uVar4 = raster->format;
  uVar2 = uVar4 & 0xf00;
  switch(raster->type) {
  case 1:
    if ((uVar4 & 0xf000) == 0) {
      if (raster->depth == cameraZDepth || raster->depth == 0) {
        raster->depth = cameraZDepth;
        if ((uVar2 == 0) || ((iVar1 != 0x10 || uVar2 == 0x700 && (uVar2 == 0x900 || iVar1 != 0x20)))
           ) {
          raster->format = (uint)(iVar1 != 0x10) * 0x200 + 0x700;
          return 1;
        }
        uStack_30 = 0x86;
      }
      else {
        uStack_30 = 0x7f;
      }
    }
    else {
      uStack_30 = 0x7b;
    }
    goto LAB_00123766;
  case 2:
    if ((uVar4 & 0xf000) == 0) {
      if (raster->depth == cameraDepth || raster->depth == 0) {
        raster->depth = cameraDepth;
        if (uVar2 == cameraFormat || uVar2 == 0) {
          raster->format = cameraFormat;
          return 1;
        }
        uStack_30 = 0x98;
      }
      else {
        uStack_30 = 0x93;
      }
    }
    else {
      uStack_30 = 0x8f;
    }
    goto LAB_00123766;
  case 3:
    goto switchD_001231e9_caseD_3;
  case 4:
    goto switchD_001231e9_caseD_4;
  }
  if ((uVar4 & 0xf000) != 0) {
    uStack_30 = 0xa1;
    goto LAB_00123766;
  }
switchD_001231e9_caseD_4:
  if (uVar2 == 0) {
    uVar4 = uVar4 & 0x9000;
    uVar2 = 0x500;
    switch(raster->depth << 0x1e | raster->depth - 4U >> 2) {
    case 0:
      raster->format = uVar4 | 0x4100;
      uVar2 = 0x100;
      goto switchD_00123219_caseD_2;
    case 1:
      raster->format = uVar4 | 0x2100;
      uVar2 = 0x100;
      goto switchD_00123219_caseD_1;
    default:
      uVar2 = 0x100;
    case 5:
    case 7:
      raster->format = uVar4 | uVar2;
    }
  }
  else {
    raster->format = uVar4 & 0xff00;
    switch(uVar4 >> 0xd & 3) {
    case 1:
switchD_00123219_caseD_1:
      if ((raster->depth & 0xfffffff7U) == 0) {
        raster->depth = 8;
        if ((uVar2 & 0xb00) == 0x100) {
          return 1;
        }
        uStack_30 = 0xc9;
      }
      else {
        uStack_30 = 0xc4;
      }
      goto LAB_00123766;
    case 2:
switchD_00123219_caseD_2:
      if ((raster->depth & 0xfffffffbU) == 0) {
        raster->depth = 4;
        if ((uVar2 & 0xb00) == 0x100) {
          return 1;
        }
        uStack_30 = 0xd3;
      }
      else {
        uStack_30 = 0xce;
      }
      goto LAB_00123766;
    case 3:
      uStack_30 = 0xd7;
      goto LAB_00123766;
    }
  }
  if (uVar2 == 0x600) {
    if ((raster->depth == 0) || (raster->depth == 0x18)) {
      raster->depth = 0x18;
      return 1;
    }
    uStack_30 = 0xe9;
  }
  else if (uVar2 == 0x500) {
    if ((raster->depth & 0xffffffdfU) == 0) {
      raster->depth = 0x20;
      return 1;
    }
    uStack_30 = 0xe2;
  }
  else if (uVar2 == 0x100) {
    if ((raster->depth & 0xffffffefU) == 0) {
      raster->depth = 0x10;
      return 1;
    }
    uStack_30 = 0xdc;
  }
  else {
    uStack_30 = 0xee;
  }
LAB_00123766:
  _e.plugin = 0xb00;
  _e.code = 0x8000000a;
  fprintf(_stderr,"%s:%d: ",
          "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
          uStack_30);
  __stream = _stderr;
  pcVar3 = dbgsprint(0x8000000a);
  fprintf(__stream,"%s\n",pcVar3);
  setError(&_e);
  return 0;
}

Assistant:

int32
getRasterFormat(Raster *raster)
{
	int32 palformat, pixelformat, mipmapflags;
	pixelformat = raster->format & 0xF00;
	palformat = raster->format & 0x6000;
	mipmapflags = raster->format & 0x9000;
	switch(raster->type){
	case Raster::ZBUFFER:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		if(raster->depth && raster->depth != cameraZDepth){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		raster->depth = cameraZDepth;
		if(pixelformat){
			if((raster->depth == 16 && pixelformat != Raster::D16) ||
			   (raster->depth == 32 && pixelformat != Raster::D32)){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
		}
		pixelformat = raster->depth == 16 ? Raster::D16 : Raster::D32;
		raster->format = pixelformat;
		break;
	case Raster::CAMERA:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		if(raster->depth && raster->depth != cameraDepth){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		raster->depth = cameraDepth;
		if(pixelformat && pixelformat != cameraFormat){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		pixelformat = cameraFormat;
		raster->format = pixelformat;
		break;
	case Raster::NORMAL:
	case Raster::CAMERATEXTURE:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		/* fallthrough */
	case Raster::TEXTURE:
		// Find raster format by depth if none was given
		if(pixelformat == 0)
			switch(raster->depth){
			case 4:
				pixelformat = Raster::C1555;
				palformat = Raster::PAL4;
				break;
			case 8:
				pixelformat = Raster::C1555;
				palformat = Raster::PAL8;
				break;
			case 24:
			// unsafe
			//	pixelformat = Raster::C888;
			//	palformat = 0;
			//	break;
			case 32:
				pixelformat = Raster::C8888;
				palformat = 0;
				break;
			default:
				pixelformat = Raster::C1555;
				palformat = 0;
				break;
			}
		raster->format = pixelformat | palformat | mipmapflags;
		// Sanity check raster format and depth; set depth if none given
		if(palformat){
			if(palformat == Raster::PAL8){
				if(raster->depth && raster->depth != 8){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
				raster->depth = 8;
				if(pixelformat != Raster::C1555 && pixelformat != Raster::C8888){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
			}else if(palformat == Raster::PAL4){
				if(raster->depth && raster->depth != 4){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
				raster->depth = 4;
				if(pixelformat != Raster::C1555 && pixelformat != Raster::C8888){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
			}else{
				RWERROR((ERR_INVRASTER));
				return 0;
			}
		}else if(pixelformat == Raster::C1555){
			if(raster->depth && raster->depth != 16){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 16;
		}else if(pixelformat == Raster::C8888){
			if(raster->depth && raster->depth != 32){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 32;
		}else if(pixelformat == Raster::C888){
			assert(0 && "24 bit rasters not supported");
			if(raster->depth && raster->depth != 24){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 24;
		}else{
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}
	return 1;
}